

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_buffering.c
# Opt level: O3

void bigendian_encode_u64(uint8_t *bytes,uint64_t value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  
  auVar2 = vpbroadcastq_avx512vl();
  auVar2 = vpsrlvq_avx2(auVar2,_DAT_001050a0);
  auVar1 = vpmovqb_avx512vl(auVar2);
  *(int *)bytes = auVar1._0_4_;
  bytes[4] = (uint8_t)(value >> 0x18);
  bytes[5] = (uint8_t)(value >> 0x10);
  bytes[6] = (uint8_t)(value >> 8);
  bytes[7] = (uint8_t)value;
  return;
}

Assistant:

ASCON_INLINE void
bigendian_encode_u64(uint8_t* const bytes, const uint64_t value)
{
    bytes[0] = (uint8_t) (value >> 56U);
    bytes[1] = (uint8_t) (value >> 48U);
    bytes[2] = (uint8_t) (value >> 40U);
    bytes[3] = (uint8_t) (value >> 32U);
    bytes[4] = (uint8_t) (value >> 24U);
    bytes[5] = (uint8_t) (value >> 16U);
    bytes[6] = (uint8_t) (value >> 8U);
    bytes[7] = (uint8_t) (value);
}